

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_gaptr.c
# Opt level: O1

nghttp3_range nghttp3_gaptr_get_first_gap_after(nghttp3_gaptr *gaptr,uint64_t offset)

{
  size_t sVar1;
  nghttp3_ksl_blk *pnVar2;
  long lVar3;
  uint64_t uVar4;
  nghttp3_range nVar5;
  nghttp3_range q;
  uint64_t local_38;
  long local_30;
  nghttp3_ksl_it local_28;
  
  local_30 = offset + 1;
  local_38 = offset;
  sVar1 = nghttp3_ksl_len(&gaptr->gap);
  if (sVar1 == 0) {
    uVar4 = 0xffffffffffffffff;
    pnVar2 = (nghttp3_ksl_blk *)0x0;
  }
  else {
    nghttp3_ksl_lower_bound_search
              (&local_28,&gaptr->gap,&local_38,nghttp3_ksl_range_exclusive_search);
    if ((local_28.i == ((local_28.blk)->field_0).field_0.n) &&
       (((local_28.blk)->field_0).field_0.next == (nghttp3_ksl_blk *)0x0)) {
      __assert_fail("!nghttp3_ksl_it_end(&it)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_gaptr.c"
                    ,0x87,
                    "nghttp3_range nghttp3_gaptr_get_first_gap_after(nghttp3_gaptr *, uint64_t)");
    }
    lVar3 = local_28.i * (local_28.ksl)->nodelen;
    pnVar2 = (((anon_union_32_2_22804d16_for_nghttp3_ksl_blk_0 *)
              ((long)&local_28.blk[1].field_0 + lVar3))->field_0).next;
    uVar4 = *(uint64_t *)((long)&local_28.blk[1].field_0 + lVar3 + 8);
  }
  nVar5.end = uVar4;
  nVar5.begin = (uint64_t)pnVar2;
  return nVar5;
}

Assistant:

nghttp3_range nghttp3_gaptr_get_first_gap_after(nghttp3_gaptr *gaptr,
                                                uint64_t offset) {
  nghttp3_range q = {
    .begin = offset,
    .end = offset + 1,
  };
  nghttp3_ksl_it it;

  if (nghttp3_ksl_len(&gaptr->gap) == 0) {
    nghttp3_range r = {0, UINT64_MAX};
    return r;
  }

  it = nghttp3_ksl_lower_bound_search(&gaptr->gap, &q,
                                      nghttp3_ksl_range_exclusive_search);

  assert(!nghttp3_ksl_it_end(&it));

  return *(nghttp3_range *)nghttp3_ksl_it_key(&it);
}